

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

string * __thiscall filesystem::path::extension_abi_cxx11_(path *this)

{
  allocator<char> *__a;
  string *in_RDI;
  size_t pos;
  string *name;
  allocator<char> local_41;
  path *in_stack_ffffffffffffffc8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  filename_abi_cxx11_(in_stack_ffffffffffffffc8);
  __a = (allocator<char> *)std::__cxx11::string::find_last_of(&stack0xffffffffffffffc8,0x953d07);
  if (__a == (allocator<char> *)0xffffffffffffffff) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (in_stack_ffffffffffffffd0,(char *)in_stack_ffffffffffffffc8,__a);
    std::allocator<char>::~allocator(&local_41);
  }
  else {
    std::__cxx11::string::substr((ulong)in_RDI,(ulong)&stack0xffffffffffffffc8);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  return in_RDI;
}

Assistant:

std::string extension() const {
        const std::string &name = filename();
        size_t pos = name.find_last_of(".");
        if (pos == std::string::npos)
            return "";
        return name.substr(pos+1);
    }